

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void proto2_unittest::TestOneof2_NestedMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestOneof2_NestedMessage **v1;
  TestOneof2_NestedMessage **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedField<int> *this;
  RepeatedField<int> *other;
  uint32_t *puVar3;
  TestOneof2_NestedMessage *pTVar4;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestOneof2_NestedMessage *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestOneof2_NestedMessage *from;
  TestOneof2_NestedMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestOneof2_NestedMessage *)to_msg;
  _this = (TestOneof2_NestedMessage *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestOneof2_NestedMessage *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestOneof2_NestedMessage_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestOneof2_NestedMessage*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestOneof2_NestedMessage_const*,proto2_unittest::TestOneof2_NestedMessage*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
               ,0x8b32,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  this = _internal_mutable_corge_int(from);
  other = _internal_corge_int((TestOneof2_NestedMessage *)arena);
  google::protobuf::RepeatedField<int>::MergeFrom(this,other);
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_78 = *puVar3;
  if ((local_78 & 3) != 0) {
    if ((local_78 & 1) != 0) {
      if ((arena->impl_).first_owner_ == (void *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_90,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest.pb.cc"
                   ,0x8b3a,"from._impl_.child_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_90);
      }
      if ((from->field_0)._impl_.child_ == (TestOneof2_NestedMessage *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).first_owner_;
        local_10 = absl_log_internal_check_op_result;
        pTVar4 = (TestOneof2_NestedMessage *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::TestOneof2_NestedMessage>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.child_ = pTVar4;
      }
      else {
        MergeFrom((from->field_0)._impl_.child_,
                  (TestOneof2_NestedMessage *)(arena->impl_).first_owner_);
      }
    }
    if ((local_78 & 2) != 0) {
      (from->field_0)._impl_.moo_int_ = (int64_t)(arena->impl_).first_arena_.ptr_._M_b._M_p;
    }
  }
  uVar1 = local_78;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestOneof2_NestedMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneof2_NestedMessage*>(&to_msg);
  auto& from = static_cast<const TestOneof2_NestedMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestOneof2.NestedMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_corge_int()->MergeFrom(from._internal_corge_int());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.child_ != nullptr);
      if (_this->_impl_.child_ == nullptr) {
        _this->_impl_.child_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.child_);
      } else {
        _this->_impl_.child_->MergeFrom(*from._impl_.child_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.moo_int_ = from._impl_.moo_int_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}